

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aistr.cpp
# Opt level: O2

void __thiscall
Test_aistr_checkPointerNotNull_Test::TestBody(Test_aistr_checkPointerNotNull_Test *this)

{
  bool bVar1;
  AssertHelper AStack_28;
  AssertHelper local_20;
  char buf [10];
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    ai::checkPointerNotNull((char *)0x0);
  }
  testing::Message::Message((Message *)buf);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_28,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
             ,0x19,
             "Expected: ai::checkPointerNotNull(nullptr) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_28,(Message *)buf);
  testing::internal::AssertHelper::~AssertHelper(&AStack_28);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)buf);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    ai::checkPointerNotNull((char *)0x0);
  }
  testing::Message::Message((Message *)&AStack_28);
  testing::internal::AssertHelper::AssertHelper
            (&local_20,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
             ,0x1c,
             "Expected: ai::checkPointerNotNull(ptr) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_20,(Message *)&AStack_28);
  testing::internal::AssertHelper::~AssertHelper(&local_20);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&AStack_28);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      ai::checkPointerNotNull(buf);
    }
  }
  else {
    testing::Message::Message((Message *)&AStack_28);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x1e,
               "Expected: ai::checkPointerNotNull(ptr) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&AStack_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_28);
  }
  return;
}

Assistant:

TEST_F(Test_aistr, checkPointerNotNull) {
    EXPECT_THROW(ai::checkPointerNotNull(nullptr), std::invalid_argument);
    char buf[10];
    char* ptr = nullptr;
    EXPECT_THROW(ai::checkPointerNotNull(ptr), std::invalid_argument);
    ptr = &buf[0];
    EXPECT_NO_THROW(ai::checkPointerNotNull(ptr));
}